

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void set_game_window_attributes(tgestate_t *state,attribute_t attrs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 *puVar3;
  undefined1 in_SIL;
  undefined4 *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  uint8_t iters;
  uint16_t stride;
  uint8_t *in_stack_00000008;
  uint8_t rows;
  attribute_t *attributes;
  char local_1d;
  char local_19;
  undefined1 *local_18;
  
  local_18 = (undefined1 *)(*(long *)(in_RDI + 6) + 0x1877);
  local_19 = (char)in_RDI[3] + -1;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[2];
  do {
    local_1d = (char)in_RDI[2] + -1;
    do {
      puVar3 = local_18 + 1;
      *local_18 = in_SIL;
      local_1d = local_1d + -1;
      local_18 = puVar3;
    } while (local_1d != '\0');
    local_18 = puVar3 + (int)(uint)(ushort)((short)uVar1 - ((short)uVar2 + -1));
    local_19 = local_19 + -1;
  } while (local_19 != '\0');
  invalidate_attrs((tgestate_t *)attributes,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  return;
}

Assistant:

void set_game_window_attributes(tgestate_t *state, attribute_t attrs)
{
  attribute_t *attributes; /* was HL */
  uint8_t      rows;       /* was C */
  uint16_t     stride;     /* was DE */

  assert(state != NULL);
  assert(attrs >= attribute_BLUE_OVER_BLACK && attrs <= attribute_BRIGHT_WHITE_OVER_BLACK);

  attributes = &state->speccy->screen.attributes[0x0047];
  rows   = state->rows - 1;
  stride = state->width - (state->columns - 1); /* e.g. 32 - 23 = 9 */
  do
  {
    uint8_t iters;

    iters = state->columns - 1; /* e.g. 23 */
    do
      *attributes++ = attrs;
    while (--iters);
    attributes += stride;
  }
  while (--rows);

  /* Conv: Invalidation added over the original game. */
  invalidate_attrs(state,
                   &state->speccy->screen.attributes[0x0047],
                   state->columns * 8,
                   (state->rows - 1) * 8);
}